

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-join6.c
# Opt level: O1

int do_send(uv_udp_send_t *send_req)

{
  int iVar1;
  int extraout_EAX;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in6 addr;
  void *local_40;
  uv_buf_t local_38;
  sockaddr_in6 local_24;
  
  local_38 = uv_buf_init("PING",4);
  iVar1 = uv_ip6_addr("ff02::1",0x23a3,&local_24);
  local_40 = (void *)(long)iVar1;
  if (local_40 == (void *)0x0) {
    iVar1 = uv_udp_send(send_req,&client,&local_38,1,(sockaddr *)&local_24,sv_send_cb);
    return iVar1;
  }
  handle = (uv_handle_t *)&local_40;
  do_send_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

static int do_send(uv_udp_send_t* send_req) {
  uv_buf_t buf;
  struct sockaddr_in6 addr;
  
  buf = uv_buf_init("PING", 4);

  ASSERT_OK(uv_ip6_addr(MULTICAST_ADDR, TEST_PORT, &addr));

  /* client sends "PING" */
  return uv_udp_send(send_req,
                     &client,
                     &buf,
                     1,
                     (const struct sockaddr*) &addr,
                     sv_send_cb);
}